

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::TPZManVector
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  ulong *puVar4;
  ulong uVar5;
  TPZManVector<TFad<6,_double>,_3> *pTVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
       (TPZManVector<TFad<6,_double>,_3> *)0x0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0189f578;
  pdVar3 = &this->fExtAlloc[0].fExtAlloc[0].val_;
  lVar9 = 0x20;
  do {
    puVar1 = (undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x38) = 0;
    *(undefined ***)((long)(this->fExtAlloc[0].fExtAlloc + -1) + lVar9) =
         &PTR__TPZManVector_0189f520;
    lVar7 = 0;
    do {
      *(undefined ***)((long)pdVar3 + lVar7 + -8) = &PTR__TFad_0185d2b8;
      *(undefined8 *)((long)pdVar3 + lVar7) = 0;
      ((undefined8 *)((long)pdVar3 + lVar7))[1] = 0;
      puVar1 = (undefined8 *)((long)pdVar3 + lVar7 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pdVar3 + lVar7 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pdVar3 + lVar7 + 0x30) = 0;
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0xc0);
    *(long *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x48) =
         (long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x30;
    lVar7 = lVar9 + 0xe0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x40) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar9 + -0x38) = 0;
    pdVar3 = pdVar3 + 0x1c;
    lVar9 = lVar7;
  } while (lVar7 != 0x2c0);
  uVar10 = (copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements;
  if ((long)uVar10 < 4) {
    pTVar6 = this->fExtAlloc;
    uVar5 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xe0),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0xe0),0) | 8;
    }
    puVar4 = (ulong *)operator_new__(uVar5);
    *puVar4 = uVar10;
    pTVar6 = (TPZManVector<TFad<6,_double>,_3> *)(puVar4 + 1);
    lVar9 = 8;
    puVar8 = puVar4;
    do {
      puVar1 = (undefined8 *)((long)puVar4 + lVar9 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar4 + lVar9 + 0x18) = 0;
      *(undefined ***)((long)puVar4 + lVar9) = &PTR__TPZManVector_0189f520;
      lVar7 = 0x30;
      do {
        *(undefined ***)((long)puVar8 + lVar7 + -8) = &PTR__TFad_0185d2b8;
        *(undefined8 *)((long)puVar8 + lVar7) = 0;
        ((undefined8 *)((long)puVar8 + lVar7))[1] = 0;
        puVar1 = (undefined8 *)((long)puVar8 + lVar7 + 0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)puVar8 + lVar7 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)puVar8 + lVar7 + 0x30) = 0;
        lVar7 = lVar7 + 0x40;
      } while (lVar7 != 0xf0);
      *(long *)((long)puVar4 + lVar9 + 8) = (long)puVar4 + lVar9 + 0x20;
      lVar7 = lVar9 + 0xe0;
      *(undefined8 *)((long)puVar4 + lVar9 + 0x10) = 0;
      *(undefined8 *)((long)puVar4 + lVar9 + 0x18) = 0;
      puVar8 = puVar8 + 0x1c;
      uVar5 = uVar10;
      lVar9 = lVar9 + 0xe0;
    } while ((ulong *)((long)puVar4 + lVar7) != puVar4 + uVar10 * 0x1c + 1);
  }
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = pTVar6;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = uVar10;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = uVar5;
  if (0 < (long)uVar10) {
    lVar9 = 0;
    do {
      TPZManVector<TFad<6,_double>,_3>::operator=
                ((TPZManVector<TFad<6,_double>,_3> *)
                 ((long)((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc
                        [0].dx_ + lVar9 + -0x30),
                 (TPZManVector<TFad<6,_double>,_3> *)
                 ((long)((copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc
                        [0].dx_ + lVar9 + -0x30));
      lVar9 = lVar9 + 0xe0;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}